

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_check_version(lys_module *module,lys_submodule *submodule,char *value,int repeat)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  LY_ECODE code;
  char *pcVar4;
  
  if (repeat == 0) {
    iVar2 = strcmp(value,"1");
    if (iVar2 == 0) {
      if (submodule == (lys_submodule *)0x0) {
        bVar1 = module->field_0x40 & 0xf1 | 2;
LAB_0014c517:
        module->field_0x40 = bVar1;
      }
      else if ((module->field_0x40 & 0xc) != 0) goto LAB_0014c4f8;
LAB_0014c51b:
      iVar2 = 0;
      goto LAB_0014c483;
    }
    iVar2 = strcmp(value,"1.1");
    if (iVar2 != 0) {
      pcVar4 = "yang-version";
      code = LYE_INARG;
      pcVar3 = value;
      goto LAB_0014c476;
    }
    if (submodule == (lys_submodule *)0x0) {
      bVar1 = module->field_0x40 & 0xf1 | 4;
      goto LAB_0014c517;
    }
    if ((module->field_0x40 & 0xe) == 4) goto LAB_0014c51b;
LAB_0014c4f8:
    ly_vlog(LYE_INVER,LY_VLOG_NONE,(void *)0x0);
  }
  else {
    pcVar4 = "module";
    code = LYE_TOOMANY;
    pcVar3 = "yang version";
LAB_0014c476:
    ly_vlog(code,LY_VLOG_NONE,(void *)0x0,pcVar3,pcVar4);
  }
  iVar2 = 1;
LAB_0014c483:
  free(value);
  return iVar2;
}

Assistant:

int
yang_check_version(struct lys_module *module, struct lys_submodule *submodule, char *value, int repeat)
{
    int ret = EXIT_SUCCESS;

    if (repeat) {
        LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, "yang version", "module");
        ret = EXIT_FAILURE;
    } else {
        if (!strcmp(value, "1")) {
            if (submodule) {
                if (module->version > 1) {
                    LOGVAL(LYE_INVER, LY_VLOG_NONE, NULL);
                    ret = EXIT_FAILURE;
                 }
            } else {
                module->version = 1;
            }
        } else if (!strcmp(value, "1.1")) {
            if (submodule) {
                if (module->version != 2) {
                    LOGVAL(LYE_INVER, LY_VLOG_NONE, NULL);
                    ret = EXIT_FAILURE;
                }
            } else {
                module->version = 2;
            }
        } else {
            LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, value, "yang-version");
            ret = EXIT_FAILURE;
        }
    }
    free(value);
    return ret;
}